

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O0

int32_t al_ustr_get(ALLEGRO_USTR *ub,int pos)

{
  int errnum;
  uint in_ESI;
  long in_RDI;
  int d;
  uchar *data;
  int32_t minc;
  int remain;
  int32_t c;
  long local_48;
  int local_40;
  int in_stack_ffffffffffffffc4;
  uint local_38;
  uint local_34;
  int local_20;
  int local_1c;
  uint local_18;
  uint local_14;
  uint local_4;
  
  if ((in_RDI == 0) || (*(int *)(in_RDI + 4) < 0)) {
    local_34 = 0;
  }
  else {
    local_34 = *(uint *)(in_RDI + 4);
  }
  if (in_ESI < local_34) {
    local_38 = (uint)*(byte *)(*(long *)(in_RDI + 8) + (long)(int)in_ESI);
  }
  else {
    local_38 = 0xffffffff;
  }
  if ((int)local_38 < 0) {
    al_set_errno(in_stack_ffffffffffffffc4);
    local_4 = 0xffffffff;
  }
  else if ((int)local_38 < 0x80) {
    local_4 = local_38;
  }
  else if ((int)local_38 < 0xc2) {
    al_set_errno(in_stack_ffffffffffffffc4);
    local_4 = 0xfffffffe;
  }
  else {
    if ((int)local_38 < 0xe0) {
      local_18 = local_38 & 0x1f;
      local_1c = 1;
      local_20 = 0x80;
    }
    else if ((int)local_38 < 0xf0) {
      local_18 = local_38 & 0xf;
      local_1c = 2;
      local_20 = 0x800;
    }
    else {
      if (0xf4 < (int)local_38) {
        al_set_errno(in_stack_ffffffffffffffc4);
        return -2;
      }
      local_18 = local_38 & 7;
      local_1c = 3;
      local_20 = 0x10000;
    }
    errnum = in_ESI + local_1c;
    if ((in_RDI == 0) || (*(int *)(in_RDI + 4) < 0)) {
      local_40 = 0;
    }
    else {
      local_40 = *(int *)(in_RDI + 4);
    }
    if (local_40 < errnum) {
      al_set_errno(errnum);
      local_4 = 0xfffffffe;
    }
    else {
      local_14 = in_ESI;
      if ((in_RDI == 0) || (*(long *)(in_RDI + 8) == 0)) {
        local_48 = 0;
      }
      else {
        local_48 = *(long *)(in_RDI + 8);
      }
      while (local_1c != 0) {
        local_14 = local_14 + 1;
        if ((*(byte *)(local_48 + (int)local_14) & 0xc0) != 0x80) {
          al_set_errno(errnum);
          return -2;
        }
        local_18 = local_18 << 6 | *(byte *)(local_48 + (int)local_14) & 0x3f;
        local_1c = local_1c + -1;
      }
      if ((int)local_18 < local_20) {
        al_set_errno(errnum);
        local_4 = 0xfffffffe;
      }
      else {
        local_4 = local_18;
      }
    }
  }
  return local_4;
}

Assistant:

int32_t al_ustr_get(const ALLEGRO_USTR *ub, int pos)
{
   int32_t c;
   int remain;
   int32_t minc;
   const unsigned char *data;

   c = _al_bchare(ub, pos, -1);

   if (c < 0) {
      /* Out of bounds. */
      al_set_errno(ERANGE);
      return -1;
   }

   if (c <= 0x7F) {
      /* Plain ASCII. */
      return c;
   }

   if (c <= 0xC1) {
      /* Trailing byte of multi-byte sequence or an overlong encoding for
       * code point <= 127.
       */
      al_set_errno(EILSEQ);
      return -2;
   }

   if (c <= 0xDF) {
      /* 2-byte sequence. */
      c &= 0x1F;
      remain = 1;
      minc = 0x80;
   }
   else if (c <= 0xEF) {
      /* 3-byte sequence. */
      c &= 0x0F;
      remain = 2;
      minc = 0x800;
   }
   else if (c <= 0xF4) {
      /* 4-byte sequence. */
      c &= 0x07;
      remain = 3;
      minc = 0x10000;
   }
   else {
      /* Otherwise invalid. */
      al_set_errno(EILSEQ);
      return -2;
   }

   if (pos + remain > _al_blength(ub)) {
      al_set_errno(EILSEQ);
      return -2;
   }

   data = (const unsigned char *) _al_bdata(ub);
   while (remain--) {
      int d = data[++pos];

      if (!IS_TRAIL_BYTE(d)) {
         al_set_errno(EILSEQ);
         return -2;
      }

      c = (c << 6) | (d & 0x3F);
   }

   /* Check for overlong forms, which could be used to bypass security
    * validations.  We could also check code points aren't above U+10FFFF or in
    * the surrogate ranges, but we don't.
    */

   if (c < minc) {
      al_set_errno(EILSEQ);
      return -2;
   }

   return c;
}